

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

QSqlRecord __thiscall QSQLiteDriver::record(QSQLiteDriver *this,QString *tablename)

{
  QSqlQuery *query;
  undefined8 uVar1;
  char cVar2;
  QSqlResult *pQVar3;
  bool in_DL;
  long in_FS_OFFSET;
  QSqlQuery q;
  undefined1 local_88 [80];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  query = (QSqlQuery *)(tablename->d).ptr;
  cVar2 = (**(code **)&(tablename->d).d[6].super_QArrayData)(tablename);
  if (cVar2 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QSqlRecord::QSqlRecord((QSqlRecord *)this);
      return (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this;
    }
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (QSqlResult *)(*(code *)(tablename->d).d[0xc].super_QArrayData.alloc)(tablename);
    QSqlQuery::QSqlQuery((QSqlQuery *)&local_38,pQVar3);
    QSqlQuery::setForwardOnly(SUB81((QSqlQuery *)&local_38,0));
    QSQLiteDriverPrivate::getTableInfo
              ((QSQLiteDriverPrivate *)local_88,query,(QString *)&local_38,in_DL);
    uVar1 = local_88._0_8_;
    local_88._0_8_ = 0;
    *(undefined8 *)this = uVar1;
    QSqlIndex::~QSqlIndex((QSqlIndex *)local_88);
    QSqlQuery::~QSqlQuery((QSqlQuery *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
             (QExplicitlySharedDataPointer<QSqlRecordPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSqlRecord QSQLiteDriver::record(const QString &tablename) const
{
    Q_D(const QSQLiteDriver);
    if (!isOpen())
        return QSqlRecord();

    QSqlQuery q(createResult());
    q.setForwardOnly(true);
    return d->getTableInfo(q, tablename);
}